

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall QHostInfoCache::put(QHostInfoCache *this,QString *name,QHostInfo *info)

{
  QHostInfoCacheElement *object;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (info->d_ptr->err == NoError) {
    object = (QHostInfoCacheElement *)operator_new(0x18);
    (object->info).d_ptr = (QHostInfoPrivate *)0x0;
    (object->age).t1 = 0;
    (object->age).t2 = 0;
    QHostInfo::QHostInfo((QHostInfo *)object,-1);
    (object->age).t1 = -0x8000000000000000;
    (object->age).t2 = -0x8000000000000000;
    QHostInfo::operator=((QHostInfo *)object,info);
    (object->age).t1 = -0x8000000000000000;
    (object->age).t2 = -0x8000000000000000;
    QElapsedTimer::start();
    local_48._0_8_ = &this->mutex;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
    local_48[8] = true;
    QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::insert(&this->cache,name,object,1);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoCache::put(const QString &name, const QHostInfo &info)
{
    // if the lookup failed, don't cache
    if (info.error() != QHostInfo::NoError)
        return;

    QHostInfoCacheElement* element = new QHostInfoCacheElement();
    element->info = info;
    element->age = QElapsedTimer();
    element->age.start();

    QMutexLocker locker(&this->mutex);
    cache.insert(name, element); // cache will take ownership
}